

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O1

string * __thiscall
ZXing::OneD::DataBar::DecodeAI0139yx_abi_cxx11_
          (string *__return_storage_ptr__,DataBar *this,BitArrayView *bits,char y)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *__return_storage_ptr___00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint len;
  undefined7 in_register_00000009;
  BitArrayView *bits_00;
  ulong uVar5;
  BitArrayView *extraout_RDX;
  BitArrayView *extraout_RDX_00;
  BitArrayView *extraout_RDX_01;
  BitArrayView *extraout_RDX_02;
  BitArrayView *bits_01;
  uint __len;
  string trailer;
  string buffer;
  string local_78;
  string local_58;
  string *local_38;
  
  len = (uint)CONCAT71(in_register_00000009,y);
  local_38 = __return_storage_ptr__;
  BitArrayView::skipBits((BitArrayView *)this,2);
  DecodeAI01GTIN_abi_cxx11_(&local_58,this,bits_00);
  std::__cxx11::string::append((char *)&local_58);
  std::__cxx11::string::push_back((char)&local_58);
  uVar3 = BitArrayView::peakBits((BitArrayView *)this,2);
  *(long *)(this + 8) = *(long *)(this + 8) + 2;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  __len = 1;
  if (9 < uVar4) {
    uVar5 = (ulong)uVar4;
    uVar2 = 4;
    do {
      __len = uVar2;
      len = (uint)uVar5;
      if (len < 100) {
        __len = __len - 2;
        goto LAB_001606e3;
      }
      if (len < 1000) {
        __len = __len - 1;
        goto LAB_001606e3;
      }
      if (len < 10000) goto LAB_001606e3;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (99999 < len);
    __len = __len + 1;
    len = (uint)uVar5;
  }
LAB_001606e3:
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p + (uVar3 >> 0x1f),__len,uVar4);
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  bits_01 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    bits_01 = extraout_RDX_00;
  }
  __return_storage_ptr___00 = local_38;
  if ((char)bits == '3') {
    uVar4 = BitArrayView::peakBits((BitArrayView *)this,10);
    *(long *)(this + 8) = *(long *)(this + 8) + 10;
    ToString<int,void>(&local_78,(ZXing *)(ulong)uVar4,3,len);
    std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
    bits_01 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      bits_01 = extraout_RDX_02;
    }
  }
  DecodeGeneralPurposeBits_abi_cxx11_(&local_78,this,bits_01);
  if (local_78._M_string_length == 0) {
    (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)&__return_storage_ptr___00->field_2;
    __return_storage_ptr___00->_M_string_length = 0;
    (__return_storage_ptr___00->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(__return_storage_ptr___00,&local_58,&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

static std::string DecodeAI0139yx(BitArrayView& bits, char y)
{
	bits.skipBits(2); // Variable length symbol bit field

	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append("39");
	buffer.push_back(y);
	buffer.append(std::to_string(bits.readBits(2)));

	if (y == '3')
		buffer.append(ToString(bits.readBits(10), 3));

	auto trailer = DecodeGeneralPurposeBits(bits);
	if (trailer.empty())
		return {};

	return buffer + trailer;
}